

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubcommandTest.cpp
# Opt level: O0

void __thiscall TApp_PrefixSubcom_Test::TestBody(TApp_PrefixSubcom_Test *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  bool bVar1;
  App *this_00;
  char *pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_350;
  AssertHelper local_2b8;
  Message local_2b0;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2a5;
  undefined1 local_2a4;
  allocator local_2a3;
  allocator local_2a2;
  allocator local_2a1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  string local_278 [32];
  string local_258 [32];
  iterator local_238;
  size_type local_230;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_228;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_210;
  undefined1 local_1f8 [8];
  AssertionResult gtest_ar_2;
  Message local_1e0;
  unsigned_long local_1d8;
  size_t local_1d0;
  undefined1 local_1c8 [8];
  AssertionResult gtest_ar_1;
  Message local_1b0;
  unsigned_long local_1a8;
  size_t local_1a0;
  undefined1 local_198 [8];
  AssertionResult gtest_ar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  string local_158 [32];
  string local_138 [32];
  string local_118 [32];
  string local_f8 [32];
  iterator local_d8;
  size_type local_d0;
  allocator local_c1;
  string local_c0;
  allocator local_99;
  string local_98;
  allocator local_71;
  string local_70;
  allocator local_39;
  string local_38;
  App *local_18;
  App *subc;
  TApp_PrefixSubcom_Test *this_local;
  
  subc = (App *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"subc",&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_70,"",&local_71);
  this_00 = CLI::App::add_subcommand(&(this->super_TApp).app,&local_38,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  local_18 = this_00;
  CLI::App::prefix_command(this_00,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_98,"--simple",&local_99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c0,"",&local_c1);
  CLI::App::add_flag(&(this->super_TApp).app,&local_98,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  gtest_ar.message_.ptr_._2_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_178,"--simple",(allocator *)((long)&gtest_ar.message_.ptr_ + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_158,"subc",(allocator *)((long)&gtest_ar.message_.ptr_ + 6));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_138,"other",(allocator *)((long)&gtest_ar.message_.ptr_ + 5));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_118,"--simple",(allocator *)((long)&gtest_ar.message_.ptr_ + 4));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f8,"--mine",(allocator *)((long)&gtest_ar.message_.ptr_ + 3));
  gtest_ar.message_.ptr_._2_1_ = 0;
  local_d8 = &local_178;
  local_d0 = 5;
  __l_00._M_len = 5;
  __l_00._M_array = local_d8;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->super_TApp).args,__l_00);
  local_350 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d8;
  do {
    local_350 = local_350 + -1;
    std::__cxx11::string::~string((string *)local_350);
  } while (local_350 != &local_178);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar.message_.ptr_ + 3));
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar.message_.ptr_ + 4));
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar.message_.ptr_ + 5));
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar.message_.ptr_ + 6));
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar.message_.ptr_ + 7));
  TApp::run(&this->super_TApp);
  local_1a0 = CLI::App::remaining_size(&(this->super_TApp).app,false);
  local_1a8 = 0;
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_198,"app.remaining_size()","(size_t)0",&local_1a0,&local_1a8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_198);
  if (!bVar1) {
    testing::Message::Message(&local_1b0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_198);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
               ,0x1a3,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_1b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_1b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_198);
  local_1d0 = CLI::App::remaining_size(&(this->super_TApp).app,true);
  local_1d8 = 3;
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_1c8,"app.remaining_size(true)","(size_t)3",&local_1d0,
             &local_1d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c8);
  if (!bVar1) {
    testing::Message::Message(&local_1e0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
               ,0x1a4,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_1e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_1e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c8);
  CLI::App::remaining_abi_cxx11_(&local_210,local_18,false);
  local_2a4 = 1;
  local_2a0 = &local_298;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_298,"other",&local_2a1);
  local_2a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_278;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_278,"--simple",&local_2a2);
  local_2a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_258;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_258,"--mine",&local_2a3);
  local_2a4 = 0;
  local_238 = &local_298;
  local_230 = 3;
  CLI::std::
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_2a5);
  __l._M_len = local_230;
  __l._M_array = local_238;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_228,__l,&local_2a5);
  testing::internal::EqHelper<false>::
  Compare<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((EqHelper<false> *)local_1f8,"subc->remaining()",
             "std::vector<std::string>({\"other\", \"--simple\", \"--mine\"})",&local_210,&local_228
            );
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_228);
  CLI::std::
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_2a5);
  local_3f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_238;
  do {
    local_3f8 = local_3f8 + -1;
    std::__cxx11::string::~string((string *)local_3f8);
  } while (local_3f8 != &local_298);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a3);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a2);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a1);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_210);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f8);
  if (!bVar1) {
    testing::Message::Message(&local_2b0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1f8);
    testing::internal::AssertHelper::AssertHelper
              (&local_2b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
               ,0x1a5,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2b8,&local_2b0);
    testing::internal::AssertHelper::~AssertHelper(&local_2b8);
    testing::Message::~Message(&local_2b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f8);
  return;
}

Assistant:

TEST_F(TApp, PrefixSubcom) {
    auto subc = app.add_subcommand("subc");
    subc->prefix_command();

    app.add_flag("--simple");

    args = {"--simple", "subc", "other", "--simple", "--mine"};
    run();

    EXPECT_EQ(app.remaining_size(), (size_t)0);
    EXPECT_EQ(app.remaining_size(true), (size_t)3);
    EXPECT_EQ(subc->remaining(), std::vector<std::string>({"other", "--simple", "--mine"}));
}